

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O3

void tbx_destroy(tbx_t *tbx)

{
  kh_s2i_t *h;
  khint_t kVar1;
  byte bVar2;
  uint uVar3;
  
  h = (kh_s2i_t *)tbx->dict;
  if (h != (kh_s2i_t *)0x0) {
    kVar1 = h->n_buckets;
    if (kVar1 != 0) {
      bVar2 = 0;
      uVar3 = 0;
      do {
        if ((h->flags[uVar3 >> 4] >> (bVar2 & 0x1e) & 3) == 0) {
          free(h->keys[uVar3]);
          kVar1 = h->n_buckets;
        }
        uVar3 = uVar3 + 1;
        bVar2 = bVar2 + 2;
      } while (uVar3 != kVar1);
    }
  }
  hts_idx_destroy(tbx->idx);
  kh_destroy_s2i(h);
  free(tbx);
  return;
}

Assistant:

void tbx_destroy(tbx_t *tbx)
{
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;
    if (d != NULL)
    {
        khint_t k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
    }
    hts_idx_destroy(tbx->idx);
    kh_destroy(s2i, d);
    free(tbx);
}